

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O0

void __thiscall
passthrough_resampler<short>::~passthrough_resampler(passthrough_resampler<short> *this)

{
  passthrough_resampler<short> *in_RDI;
  
  ~passthrough_resampler(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::
    cubeb_resampler_speex(InputProcessor * input_processor,
                          OutputProcessor * output_processor, cubeb_stream * s,
                          cubeb_data_callback cb, void * ptr)
    : input_processor(input_processor), output_processor(output_processor),
      stream(s), data_callback(cb), user_ptr(ptr)
{
  if (input_processor && output_processor) {
    fill_internal = &cubeb_resampler_speex::fill_internal_duplex;
  } else if (input_processor) {
    fill_internal = &cubeb_resampler_speex::fill_internal_input;
  } else if (output_processor) {
    fill_internal = &cubeb_resampler_speex::fill_internal_output;
  }
}